

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.c
# Opt level: O0

int main(int argc,char **argv)

{
  cf_bool_t cVar1;
  cf_int32_t cVar2;
  cf_size_t cVar3;
  cf_char_t local_98 [8];
  cf_char_t buf [100];
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  char cStack_28;
  char cStack_27;
  cf_char_t s1 [12];
  cf_char_t s [10];
  char **argv_local;
  int argc_local;
  
  builtin_memcpy(s1 + 4,"  12345\t",8);
  buf[0x62] = 'a';
  buf[99] = '1';
  cStack_2c = '2';
  cStack_2b = '3';
  cStack_2a = '4';
  cStack_29 = 'b';
  cStack_28 = 'c';
  cStack_27 = 'd';
  builtin_memcpy(s1,"efg",4);
  cVar1 = cf_str_strip(s1 + 4);
  if (cVar1 == 0) {
    __assert_fail("cf_str_strip(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0xc,"int main(int, char **)");
  }
  cVar2 = cf_strcmp("12345",s1 + 4);
  if (cVar2 != 0) {
    __assert_fail("cf_strcmp(\"12345\", s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0xd,"int main(int, char **)");
  }
  cVar1 = cf_str_capitalize(buf + 0x62);
  if (cVar1 == 0) {
    __assert_fail("cf_str_capitalize(s1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0xf,"int main(int, char **)");
  }
  cVar2 = cf_strcmp(buf + 0x62,"A1234bcdefg");
  if (cVar2 != 0) {
    __assert_fail("cf_strcmp(s1, \"A1234bcdefg\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0x10,"int main(int, char **)");
  }
  cVar1 = cf_str_switch_case(buf + 0x62);
  if (cVar1 == 0) {
    __assert_fail("cf_str_switch_case(s1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0x12,"int main(int, char **)");
  }
  cVar2 = cf_strcmp(buf + 0x62,"a1234BCDEFG");
  if (cVar2 != 0) {
    __assert_fail("cf_strcmp(s1, \"a1234BCDEFG\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0x13,"int main(int, char **)");
  }
  cVar1 = cf_str_to_upper(buf + 0x62);
  if (cVar1 == 0) {
    __assert_fail("cf_str_to_upper(s1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0x15,"int main(int, char **)");
  }
  cVar2 = cf_strcmp(buf + 0x62,"A1234BCDEFG");
  if (cVar2 == 0) {
    cVar1 = cf_str_to_lower(buf + 0x62);
    if (cVar1 == 0) {
      __assert_fail("cf_str_to_lower(s1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                    ,0x18,"int main(int, char **)");
    }
    cVar2 = cf_strcmp(buf + 0x62,"a1234bcdefg");
    if (cVar2 != 0) {
      __assert_fail("cf_strcmp(s1, \"a1234bcdefg\") == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                    ,0x19,"int main(int, char **)");
    }
    cVar3 = cf_str_count_for("11223311",'1');
    if (cVar3 != 4) {
      __assert_fail("cf_str_count_for(\"11223311\", \'1\') == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                    ,0x1b,"int main(int, char **)");
    }
    cf_str_center(local_98,100,"abcde",'*',10);
    cVar2 = cf_strcmp(local_98,"**abcde***");
    if (cVar2 == 0) {
      return 0;
    }
    __assert_fail("cf_strcmp(buf, \"**abcde***\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                  ,0x1e,"int main(int, char **)");
  }
  __assert_fail("cf_strcmp(s1, \"A1234BCDEFG\") == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_str.c"
                ,0x16,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cf_char_t s[] = "  12345\t ";
    cf_char_t s1[] = "a1234bcdefg";

    cf_char_t buf[100];

    cf_assert(cf_str_strip(s));
    cf_assert(cf_strcmp("12345", s) == 0);

    cf_assert(cf_str_capitalize(s1));
    cf_assert(cf_strcmp(s1, "A1234bcdefg") == 0);

    cf_assert(cf_str_switch_case(s1));
    cf_assert(cf_strcmp(s1, "a1234BCDEFG") == 0);

    cf_assert(cf_str_to_upper(s1));
    cf_assert(cf_strcmp(s1, "A1234BCDEFG") == 0);

    cf_assert(cf_str_to_lower(s1));
    cf_assert(cf_strcmp(s1, "a1234bcdefg") == 0);

    cf_assert(cf_str_count_for("11223311", '1') == 4);

    cf_str_center(buf, 100, "abcde", '*', 10);
    cf_assert(cf_strcmp(buf, "**abcde***") == 0);
    return 0;
}